

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::UninterpretedOption_NamePart::MergePartialFromCodedStream
          (UninterpretedOption_NamePart *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *value;
  char *data;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  UninterpretedOption_NamePart *this_local;
  uint32 local_38;
  uint32 local_24;
  bool *pbStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_38 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_38 = input->last_tag_;
      }
      if (local_38 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_38);
      if (iVar3 != 1) break;
      WVar4 = internal::WireFormatLite::GetTagWireType(local_38);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) {
        value = mutable_name_part_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,value);
        if (!bVar1) {
          return false;
        }
        name_part_abi_cxx11_(this);
        data = (char *)std::__cxx11::string::data();
        name_part_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8String(data,iVar3,PARSE);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x10')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) goto LAB_00307bc7;
      }
      else {
LAB_00307c3b:
        WVar4 = internal::WireFormatLite::GetTagWireType(local_38);
        if (WVar4 == WIRETYPE_END_GROUP) {
          return true;
        }
        unknown_fields = mutable_unknown_fields(this);
        bVar1 = internal::WireFormat::SkipField(input,local_38,unknown_fields);
        if (!bVar1) {
          return false;
        }
      }
    }
    if ((iVar3 != 2) ||
       (WVar4 = internal::WireFormatLite::GetTagWireType(local_38), WVar4 != WIRETYPE_VARINT))
    goto LAB_00307c3b;
LAB_00307bc7:
    pbStack_20 = &this->is_extension_;
    local_18 = input;
    local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
    if (!(bool)local_9) {
      return false;
    }
    *pbStack_20 = local_24 != 0;
    set_has_is_extension(this);
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption_NamePart::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // required string name_part = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name_part()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name_part().data(), this->name_part().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_is_extension;
        break;
      }

      // required bool is_extension = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_is_extension:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_extension_)));
          set_has_is_extension();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}